

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void TestParseInvalidUnicodeHex(void)

{
  BubbleValue *pBVar1;
  FILE *pFVar2;
  ValueTypes VVar3;
  __tuple_element_t<0UL,_tuple<ParseResults,_BubbleValue_*>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> *ppBVar5;
  char *pcVar6;
  BubbleJson local_e8;
  BubbleJson local_d8;
  BubbleJson local_c8;
  BubbleJson local_b8;
  BubbleJson local_a8;
  BubbleJson local_98;
  BubbleJson local_88;
  BubbleJson local_78;
  BubbleJson local_68;
  BubbleJson local_58;
  BubbleJson local_48;
  BubbleJson local_38;
  BubbleJson local_28;
  undefined1 local_18 [8];
  tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> result;
  
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::tuple<true,_true>
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  bubbleJson::BubbleJson::Parse(&local_28,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_28;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xce
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xce
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_38,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_38;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xcf
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xcf
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_48,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_48;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd0
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd0
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_58,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_58;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd1
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd1
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_68,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_68;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd2
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd2
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_78,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_78;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd3
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd3
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_88,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_88;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd4
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd4
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_98,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_98;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd5
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd5
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_a8,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_a8;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd6
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd6
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_b8,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_b8;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd7
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd7
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_c8,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_c8;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd8
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd8
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_d8,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_d8;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd9
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xd9
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_e8,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_e8;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_InvalidUnicodeHex) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xda
            ,8,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0xda
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  return;
}

Assistant:

static void TestParseInvalidUnicodeHex()
{
    tuple<ParseResults, BubbleValue*> result;

    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u0\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u01\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u012\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u/000\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\uG000\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u0/00\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u0G00\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u0/00\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u00G0\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u000/\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u000G\"");
    TEST_ERROR(ParseResult_InvalidUnicodeHex, "\"\\u 123\"");
}